

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

void __thiscall irr::gui::IGUIElement::draw(IGUIElement *this)

{
  bool bVar1;
  ulong uVar2;
  reference ppIVar3;
  long *in_RDI;
  IGUIElement *child;
  iterator __end3;
  iterator __begin3;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *__range3;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *in_stack_ffffffffffffffc8
  ;
  _Self local_20;
  _Self local_18;
  long *local_10;
  
  uVar2 = (**(code **)(*in_RDI + 0x68))();
  if ((uVar2 & 1) != 0) {
    local_10 = in_RDI + 1;
    local_18._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::
         begin(in_stack_ffffffffffffffc8);
    local_20._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::
         end(in_stack_ffffffffffffffc8);
    while (bVar1 = ::std::operator!=(&local_18,&local_20), bVar1) {
      ppIVar3 = ::std::_List_iterator<irr::gui::IGUIElement_*>::operator*
                          ((_List_iterator<irr::gui::IGUIElement_*> *)0x39d75a);
      (*((*ppIVar3)->super_IEventReceiver)._vptr_IEventReceiver[10])();
      ::std::_List_iterator<irr::gui::IGUIElement_*>::operator++(&local_18);
    }
  }
  return;
}

Assistant:

virtual void draw()
	{
		if (isVisible()) {
			for (auto child : Children)
				child->draw();
		}
	}